

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::~cmGlobalUnixMakefileGenerator3
          (cmGlobalUnixMakefileGenerator3 *this)

{
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator =
       (_func_int **)&PTR__cmGlobalUnixMakefileGenerator3_0150ef20;
  std::
  map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  ::~map(&this->DirectoryTargetsMap);
  std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::~unique_ptr
            (&this->CommandDatabase);
  std::
  map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
  ::~map(&this->ProgressMap);
  std::__cxx11::string::~string((string *)&this->EmptyRuleHackCommand);
  std::__cxx11::string::~string((string *)&this->EmptyRuleHackDepends);
  std::__cxx11::string::~string((string *)&this->LineContinueDirective);
  std::__cxx11::string::~string((string *)&this->IncludeDirective);
  cmGlobalCommonGenerator::~cmGlobalCommonGenerator(&this->super_cmGlobalCommonGenerator);
  return;
}

Assistant:

cmGlobalUnixMakefileGenerator3::~cmGlobalUnixMakefileGenerator3() = default;